

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void generate_table_filename(char *sort,uint time_iter,uint global_iteration,char *filename)

{
  char dirname [64];
  
  mkdir("results",0x1c0);
  mkdir("results/dat",0x1c0);
  dirname[0x30] = '\0';
  dirname[0x31] = '\0';
  dirname[0x32] = '\0';
  dirname[0x33] = '\0';
  dirname[0x34] = '\0';
  dirname[0x35] = '\0';
  dirname[0x36] = '\0';
  dirname[0x37] = '\0';
  dirname[0x38] = '\0';
  dirname[0x39] = '\0';
  dirname[0x3a] = '\0';
  dirname[0x3b] = '\0';
  dirname[0x3c] = '\0';
  dirname[0x3d] = '\0';
  dirname[0x3e] = '\0';
  dirname[0x3f] = '\0';
  dirname[0x20] = '\0';
  dirname[0x21] = '\0';
  dirname[0x22] = '\0';
  dirname[0x23] = '\0';
  dirname[0x24] = '\0';
  dirname[0x25] = '\0';
  dirname[0x26] = '\0';
  dirname[0x27] = '\0';
  dirname[0x28] = '\0';
  dirname[0x29] = '\0';
  dirname[0x2a] = '\0';
  dirname[0x2b] = '\0';
  dirname[0x2c] = '\0';
  dirname[0x2d] = '\0';
  dirname[0x2e] = '\0';
  dirname[0x2f] = '\0';
  dirname[0x10] = '\0';
  dirname[0x11] = '\0';
  dirname[0x12] = '\0';
  dirname[0x13] = '\0';
  dirname[0x14] = '\0';
  dirname[0x15] = '\0';
  dirname[0x16] = '\0';
  dirname[0x17] = '\0';
  dirname[0x18] = '\0';
  dirname[0x19] = '\0';
  dirname[0x1a] = '\0';
  dirname[0x1b] = '\0';
  dirname[0x1c] = '\0';
  dirname[0x1d] = '\0';
  dirname[0x1e] = '\0';
  dirname[0x1f] = '\0';
  dirname[0] = '\0';
  dirname[1] = '\0';
  dirname[2] = '\0';
  dirname[3] = '\0';
  dirname[4] = '\0';
  dirname[5] = '\0';
  dirname[6] = '\0';
  dirname[7] = '\0';
  dirname[8] = '\0';
  dirname[9] = '\0';
  dirname[10] = '\0';
  dirname[0xb] = '\0';
  dirname[0xc] = '\0';
  dirname[0xd] = '\0';
  dirname[0xe] = '\0';
  dirname[0xf] = '\0';
  snprintf(dirname,0x40,"results/dat/%u",(ulong)global_iteration);
  mkdir(dirname,0x1c0);
  snprintf(filename,0x40,"results/dat/%u/%s_at_%u_iteration.dat",(ulong)global_iteration,sort,
           time_iter);
  return;
}

Assistant:

void generate_table_filename (char const * sort,
                              unsigned time_iter,
                              unsigned global_iteration,
                              char * filename) {

  mkdir ("results", S_IRWXU);
  mkdir ("results/dat", S_IRWXU);

  char dirname[MAX_FILENAME_SIZE] = "";
  snprintf(dirname, MAX_FILENAME_SIZE, "results/dat/%u", global_iteration);
  mkdir (dirname, S_IRWXU);

  snprintf (filename, 
            MAX_FILENAME_SIZE, 
            "results/dat/%u/%s_at_%u_iteration.dat", 
            global_iteration, 
            sort, 
            time_iter);
  return;
}